

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_pmaxub_mips(uint64_t fs,uint64_t ft)

{
  long lVar1;
  byte bVar2;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    bVar2 = vt.ub[lVar1];
    if (vt.ub[lVar1] < vs.ub[lVar1]) {
      bVar2 = vs.ub[lVar1];
    }
    vs.ub[lVar1] = bVar2;
  }
  return vs.d;
}

Assistant:

uint64_t helper_pmaxub(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.ub[i] = (vs.ub[i] >= vt.ub[i] ? vs.ub[i] : vt.ub[i]);
    }
    return vs.d;
}